

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

void __thiscall
FMultiBlockLinesIterator::FMultiBlockLinesIterator
          (FMultiBlockLinesIterator *this,FPortalGroupArray *check,double checkx,double checky,
          double checkz,double checkh,double checkradius,sector_t *newsec)

{
  short sVar1;
  subsector_t *psVar2;
  
  this->checklist = check;
  (this->bbox).m_Box[2] = 3.4028234663852886e+38;
  (this->bbox).m_Box[3] = -3.4028234663852886e+38;
  (this->bbox).m_Box[0] = -3.4028234663852886e+38;
  (this->bbox).m_Box[1] = 3.4028234663852886e+38;
  (this->checkpoint).Z = checkz;
  (this->checkpoint).Y = checky;
  (this->checkpoint).X = checkx;
  if (newsec == (sector_t *)0x0) {
    psVar2 = P_PointInSubsector(checkx,checky);
    newsec = (sector_t *)psVar2->sector;
  }
  this->startsector = newsec;
  sVar1 = (short)((sector_t_conflict *)newsec)->PortalGroup;
  this->basegroup = sVar1;
  if (check->inited == false) {
    P_CollectConnectedGroups
              ((int)sVar1,&this->checkpoint,checkz + checkh,checkradius,this->checklist);
    sVar1 = this->basegroup;
  }
  (this->checkpoint).Z = checkradius;
  this->continueup = true;
  this->continuedown = true;
  this->portalflags = 0;
  this->index = -1;
  startIteratorForGroup(this,(int)sVar1);
  return;
}

Assistant:

FMultiBlockLinesIterator::FMultiBlockLinesIterator(FPortalGroupArray &check, double checkx, double checky, double checkz, double checkh, double checkradius, sector_t *newsec)
	: checklist(check)
{
	checkpoint = { checkx, checky, checkz };
	if (newsec == NULL)	newsec = P_PointInSector(checkx, checky);
	startsector = newsec;
	basegroup = newsec->PortalGroup;
	if (!check.inited) P_CollectConnectedGroups(basegroup, checkpoint, checkz + checkh, checkradius, checklist);
	checkpoint.Z = checkradius;
	Reset();
}